

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpo.h
# Opt level: O0

bool __thiscall
lpo::
program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::has_opt(program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,string *name,string *short_name)

{
  anon_class_16_2_e0af5a9c_for__M_pred __pred;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  string *short_name_local;
  string *name_local;
  program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  __first = std::
            cbegin<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                      (&this->m_check_list);
  __last = std::
           cend<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                     (&this->m_check_list);
  __pred.short_name = short_name;
  __pred.name = name;
  bVar1 = std::
          any_of<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,lpo::program_options<int,double,std::__cxx11::string>::has_opt(std::__cxx11::string_const&,std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                    ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )__first._M_node,
                     (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )__last._M_node,__pred);
  return bVar1;
}

Assistant:

bool
  has_opt(const std::string & name, const std::string & short_name) const
  {
    return std::any_of(std::cbegin(m_check_list), std::cend(m_check_list), [&](const auto & n) {
      return (name == n.first || (!short_name.empty() && short_name == n.second));
    });
  }